

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_decimal(void)

{
  XSValue_Data actValue;
  XSValue_Data actValue_00;
  XSValue_Data actValue_01;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  byte bVar1;
  bool bVar2;
  XMLCh *pXVar3;
  char *pcVar4;
  XSValue *pXVar5;
  char *pcVar6;
  char *pcVar7;
  wchar16 *pwVar8;
  long lVar9;
  void *pvVar10;
  StrX local_900;
  StrX local_8f0;
  StrX local_8e0;
  long local_8d0;
  XMLCh *actRetCanRep_12;
  undefined1 local_8c0 [4];
  Status myStatus_24;
  StrX local_8b0;
  StrX local_8a0;
  long local_890;
  XMLCh *actRetCanRep_11;
  undefined1 local_880 [4];
  Status myStatus_23;
  StrX local_870;
  char *local_860;
  char *actRetCanRep_inchar_10;
  wchar16 *local_848;
  XMLCh *actRetCanRep_10;
  undefined1 local_838 [4];
  Status myStatus_22;
  StrX local_828;
  char *local_818;
  char *actRetCanRep_inchar_9;
  wchar16 *local_800;
  XMLCh *actRetCanRep_9;
  undefined1 local_7f0 [4];
  Status myStatus_21;
  StrX local_7e0;
  char *local_7d0;
  char *actRetCanRep_inchar_8;
  wchar16 *local_7b8;
  XMLCh *actRetCanRep_8;
  undefined1 local_7a8 [4];
  Status myStatus_20;
  StrX local_798;
  char *local_788;
  char *actRetCanRep_inchar_7;
  wchar16 *local_770;
  XMLCh *actRetCanRep_7;
  undefined1 local_760 [4];
  Status myStatus_19;
  StrX local_750;
  char *local_740;
  char *actRetCanRep_inchar_6;
  wchar16 *local_728;
  XMLCh *actRetCanRep_6;
  undefined1 local_718 [4];
  Status myStatus_18;
  StrX local_708;
  char *local_6f8;
  char *actRetCanRep_inchar_5;
  wchar16 *local_6e0;
  XMLCh *actRetCanRep_5;
  undefined1 local_6d0 [4];
  Status myStatus_17;
  StrX local_6c0;
  char *local_6b0;
  char *actRetCanRep_inchar_4;
  wchar16 *local_698;
  XMLCh *actRetCanRep_4;
  undefined1 local_688 [4];
  Status myStatus_16;
  StrX local_678;
  char *local_668;
  char *actRetCanRep_inchar_3;
  wchar16 *local_650;
  XMLCh *actRetCanRep_3;
  undefined1 local_640 [4];
  Status myStatus_15;
  StrX local_630;
  char *local_620;
  char *actRetCanRep_inchar_2;
  wchar16 *local_608;
  XMLCh *actRetCanRep_2;
  undefined1 local_5f8 [4];
  Status myStatus_14;
  StrX local_5e8;
  char *local_5d8;
  char *actRetCanRep_inchar_1;
  wchar16 *local_5c0;
  XMLCh *actRetCanRep_1;
  undefined1 local_5b0 [4];
  Status myStatus_13;
  StrX local_5a0;
  char *local_590;
  char *actRetCanRep_inchar;
  wchar16 *local_578;
  XMLCh *actRetCanRep;
  Status myStatus_12;
  int j;
  StrX local_558;
  StrX local_548;
  XSValue *local_538;
  XSValue *actRetValue_4;
  undefined1 local_528 [4];
  Status myStatus_11;
  StrX local_518;
  StrX local_508;
  XSValue *local_4f8;
  XSValue *actRetValue_3;
  undefined1 local_4e8 [4];
  Status myStatus_10;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  StrX local_488;
  XSValue *local_478;
  XSValue *actRetValue_2;
  undefined1 local_468 [4];
  Status myStatus_9;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  StrX local_408;
  XSValue *local_3f8;
  XSValue *actRetValue_1;
  undefined1 local_3e8 [4];
  Status myStatus_8;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  StrX local_388;
  XSValue *local_378;
  XSValue *actRetValue;
  Status myStatus_7;
  int i;
  StrX local_358;
  StrX local_348;
  byte local_335;
  Status local_334;
  undefined1 local_330 [3];
  bool actRetValid_6;
  Status myStatus_6;
  StrX local_320;
  StrX local_310;
  byte local_2fd;
  Status local_2fc;
  undefined1 local_2f8 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_2e8;
  byte local_2d5;
  Status local_2d4;
  undefined1 local_2d0 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_2c0;
  byte local_2ad;
  Status local_2ac;
  undefined1 local_2a8 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_298;
  byte local_285;
  Status local_284;
  undefined1 local_280 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_270;
  byte local_25d;
  Status local_25c;
  undefined1 local_258 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_238;
  byte local_225;
  Status local_224;
  char acStack_220 [3];
  bool actRetValid;
  Status myStatus;
  char data_canrep_7 [6];
  char data_rawstr_7 [7];
  char data_canrep_6 [8];
  char data_rawstr_6 [9];
  char data_canrep_5 [7];
  char data_rawstr_5 [10];
  char data_canrep_4 [7];
  char data_rawstr_4 [10];
  char data_canrep_3 [8];
  char data_rawstr_3 [6];
  char data_canrep_2 [7];
  char data_rawstr_2 [8];
  char data_canrep_1 [8];
  char data_rawstr_1 [13];
  XSValue_Data act_v_ran32_v_2;
  XSValue_Data act_v_ran32_v_1;
  XSValue_Data act_v_ran64_v_2;
  XSValue_Data act_v_ran64_v_1;
  XSValue_Data act_v_ran_v_1;
  char lex_iv_2 [12];
  char lex_iv_1 [10];
  char lex_v_ran64_iv_2 [25];
  char lex_v_ran64_iv_1 [25];
  char lex_v_ran64_v_2 [25];
  char lex_v_ran64_v_1 [25];
  char local_20 [8];
  char lex_v_ran_v_1 [14];
  bool toValidate;
  DataType dt;
  
  stack0xfffffffffffffff4 = 2;
  lex_v_ran_v_1[0xb] = '\x01';
  builtin_strncpy(lex_v_ran_v_1,"67  \n",6);
  builtin_strncpy(local_20,"  1234.5",8);
  stack0xffffffffffffffb8 = 0x3434373634343831;
  lex_v_ran64_v_2[8] = '0';
  lex_v_ran64_v_2[9] = '9';
  lex_v_ran64_v_2[10] = '5';
  lex_v_ran64_v_2[0xb] = '5';
  lex_v_ran64_v_2[0xc] = '1';
  lex_v_ran64_v_2[0xd] = '6';
  lex_v_ran64_v_2[0xe] = '1';
  lex_v_ran64_v_2[0xf] = '5';
  lex_v_ran64_v_2[0x10] = '\0';
  stack0xffffffffffffff98 = 0x343438312e393939;
  lex_v_ran64_v_2[0] = '6';
  lex_v_ran64_v_2[1] = '7';
  lex_v_ran64_v_2[2] = '4';
  lex_v_ran64_v_2[3] = '4';
  lex_v_ran64_v_2[4] = '0';
  lex_v_ran64_v_2[5] = '7';
  lex_v_ran64_v_2[6] = '3';
  lex_v_ran64_v_2[7] = '7';
  lex_v_ran64_iv_1[8] = '1';
  lex_v_ran64_iv_1[9] = '6';
  lex_v_ran64_iv_1[10] = '1';
  lex_v_ran64_iv_1[0xb] = '6';
  lex_v_ran64_iv_1[0xc] = '.';
  lex_v_ran64_iv_1[0xd] = '9';
  lex_v_ran64_iv_1[0xe] = '9';
  lex_v_ran64_iv_1[0xf] = '9';
  lex_v_ran64_iv_1[0x10] = '\0';
  stack0xffffffffffffff78 = 0x3434373634343831;
  lex_v_ran64_iv_1[0] = '0';
  lex_v_ran64_iv_1[1] = '7';
  lex_v_ran64_iv_1[2] = '3';
  lex_v_ran64_iv_1[3] = '7';
  lex_v_ran64_iv_1[4] = '0';
  lex_v_ran64_iv_1[5] = '9';
  lex_v_ran64_iv_1[6] = '5';
  lex_v_ran64_iv_1[7] = '5';
  lex_v_ran64_iv_2[8] = '0';
  lex_v_ran64_iv_2[9] = '9';
  lex_v_ran64_iv_2[10] = '5';
  lex_v_ran64_iv_2[0xb] = '5';
  lex_v_ran64_iv_2[0xc] = '1';
  lex_v_ran64_iv_2[0xd] = '6';
  lex_v_ran64_iv_2[0xe] = '1';
  lex_v_ran64_iv_2[0xf] = '6';
  lex_v_ran64_iv_2[0x10] = '\0';
  stack0xffffffffffffff58 = 0x343438312e393939;
  lex_v_ran64_iv_2[0] = '6';
  lex_v_ran64_iv_2[1] = '7';
  lex_v_ran64_iv_2[2] = '4';
  lex_v_ran64_iv_2[3] = '4';
  lex_v_ran64_iv_2[4] = '0';
  lex_v_ran64_iv_2[5] = '7';
  lex_v_ran64_iv_2[6] = '3';
  lex_v_ran64_iv_2[7] = '7';
  stack0xffffffffffffff48 = 0x35342e3433623231;
  lex_iv_1[0] = '6';
  lex_iv_1[1] = '\0';
  act_v_ran_v_1.fValue.f_datetime.f_milisec = 4.4654531780935296e-86;
  lex_iv_2[0] = '7';
  lex_iv_2[1] = '8';
  lex_iv_2[2] = '9';
  lex_iv_2[3] = '\0';
  act_v_ran_v_1.f_datatype = 0x9ba5e354;
  act_v_ran_v_1._4_4_ = 0x40934a44;
  act_v_ran64_v_1.f_datatype = dt_string;
  act_v_ran64_v_1._4_4_ = 0x43f00000;
  act_v_ran64_v_2.f_datatype = 0xca10c924;
  act_v_ran64_v_2._4_4_ = 0x408f3979;
  act_v_ran32_v_1.f_datatype = 0xfffff7cf;
  act_v_ran32_v_1._4_4_ = 0x41efffff;
  builtin_strncpy(data_canrep_1,"  -123.4",8);
  builtin_strncpy(data_rawstr_2,"-123.45",8);
  _data_canrep_2 = 0x35342e3332312b;
  stack0xfffffffffffffe4c = 0x3534;
  data_rawstr_3[0] = '1';
  data_rawstr_3[1] = '2';
  data_rawstr_3[2] = '3';
  data_rawstr_3[3] = '.';
  builtin_strncpy(data_canrep_3,"12345",6);
  stack0xfffffffffffffe38 = 0x302e3534333231;
  _data_canrep_4 = 0x342e333231303030;
  data_rawstr_4[0] = '5';
  data_rawstr_4[1] = '\0';
  stack0xfffffffffffffe20 = 0x2e333231;
  _data_canrep_5 = 0x303035342e333231;
  data_rawstr_5[0] = '0';
  data_rawstr_5[1] = '\0';
  stack0xfffffffffffffe08 = 0x2e333231;
  builtin_strncpy(data_canrep_6,"00.12345",8);
  data_rawstr_6[0] = '\0';
  _data_rawstr_7 = 0x35343332312e30;
  stack0xfffffffffffffdec = 0x3030;
  data_canrep_7[0] = '1';
  data_canrep_7[1] = '2';
  data_canrep_7[2] = '3';
  data_canrep_7[3] = '.';
  myStatus._0_2_ = 0x30;
  _acStack_220 = 0x2e333231;
  local_224 = st_Init;
  StrX::StrX(&local_238,local_20);
  pXVar3 = StrX::unicodeForm(&local_238);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_decimal,&local_224,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_238);
  local_225 = bVar1 & 1;
  if (local_225 != 1) {
    pXVar3 = getDataTypeString(dt_decimal);
    StrX::StrX((StrX *)local_258,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_258);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x336,local_20,pcVar4,1);
    StrX::~StrX((StrX *)local_258);
    errSeen = true;
  }
  local_25c = st_Init;
  StrX::StrX(&local_270,lex_v_ran64_v_2 + 0x18);
  pXVar3 = StrX::unicodeForm(&local_270);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_decimal,&local_25c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_270);
  local_25d = bVar1 & 1;
  if (local_25d != 1) {
    pXVar3 = getDataTypeString(dt_decimal);
    StrX::StrX((StrX *)local_280,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_280);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x337,lex_v_ran64_v_2 + 0x18,pcVar4,1);
    StrX::~StrX((StrX *)local_280);
    errSeen = true;
  }
  local_284 = st_Init;
  StrX::StrX(&local_298,lex_v_ran64_iv_1 + 0x18);
  pXVar3 = StrX::unicodeForm(&local_298);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_decimal,&local_284,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_298);
  local_285 = bVar1 & 1;
  if (local_285 != 1) {
    pXVar3 = getDataTypeString(dt_decimal);
    StrX::StrX((StrX *)local_2a8,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_2a8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x338,lex_v_ran64_iv_1 + 0x18,pcVar4,1);
    StrX::~StrX((StrX *)local_2a8);
    errSeen = true;
  }
  local_2ac = st_Init;
  StrX::StrX(&local_2c0,lex_v_ran64_iv_2 + 0x18);
  pXVar3 = StrX::unicodeForm(&local_2c0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_decimal,&local_2ac,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_2c0);
  local_2ad = bVar1 & 1;
  if (local_2ad != 1) {
    pXVar3 = getDataTypeString(dt_decimal);
    StrX::StrX((StrX *)local_2d0,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_2d0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x339,lex_v_ran64_iv_2 + 0x18,pcVar4,1);
    StrX::~StrX((StrX *)local_2d0);
    errSeen = true;
  }
  local_2d4 = st_Init;
  StrX::StrX(&local_2e8,lex_iv_1 + 8);
  pXVar3 = StrX::unicodeForm(&local_2e8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_decimal,&local_2d4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_2e8);
  local_2d5 = bVar1 & 1;
  if (local_2d5 != 1) {
    pXVar3 = getDataTypeString(dt_decimal);
    StrX::StrX((StrX *)local_2f8,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_2f8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x33a,lex_iv_1 + 8,pcVar4,1);
    StrX::~StrX((StrX *)local_2f8);
    errSeen = true;
  }
  local_2fc = st_Init;
  StrX::StrX(&local_310,lex_iv_2 + 8);
  pXVar3 = StrX::unicodeForm(&local_310);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_decimal,&local_2fc,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_310);
  local_2fd = bVar1 & 1;
  if (local_2fd == 0) {
    if (local_2fc != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX((StrX *)local_330,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_330);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_2fc);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x33d,lex_iv_2 + 8,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_330);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_decimal);
    StrX::StrX(&local_320,pXVar3);
    pcVar4 = StrX::localForm(&local_320);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x33d,lex_iv_2 + 8,pcVar4,0);
    StrX::~StrX(&local_320);
    errSeen = true;
  }
  local_334 = st_Init;
  StrX::StrX(&local_348,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
  pXVar3 = StrX::unicodeForm(&local_348);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_decimal,&local_334,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_348);
  local_335 = bVar1 & 1;
  if (local_335 == 0) {
    if (local_334 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX((StrX *)&myStatus_7,pXVar3);
      pcVar4 = StrX::localForm((StrX *)&myStatus_7);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_334);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x33e,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)&myStatus_7);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_decimal);
    StrX::StrX(&local_358,pXVar3);
    pcVar4 = StrX::localForm(&local_358);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x33e,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,0);
    StrX::~StrX(&local_358);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    lex_v_ran_v_1[0xb] = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = 0;
    StrX::StrX(&local_388,local_20);
    pXVar3 = StrX::unicodeForm(&local_388);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_decimal,(Status *)&actRetValue,ver_10,
                        (bool)(lex_v_ran_v_1[0xb] & 1),
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_388);
    local_378 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX((StrX *)local_3e8,pXVar3);
      StrX::localForm((StrX *)local_3e8);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x35b,local_20);
      StrX::~StrX((StrX *)local_3e8);
      errSeen = true;
    }
    else {
      memcpy(&local_3b0,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran64_v_1.fValue + 0x18);
      memcpy(&local_3d8,pvVar10,0x28);
      actValue.fValue.f_long = uStack_3a8;
      actValue._0_8_ = local_3b0;
      actValue.fValue._8_8_ = local_3a0;
      actValue.fValue._16_8_ = uStack_398;
      actValue.fValue.f_datetime.f_milisec = (double)local_390;
      expValue.fValue.f_long = uStack_3d0;
      expValue._0_8_ = local_3d8;
      expValue.fValue._8_8_ = local_3c8;
      expValue.fValue._16_8_ = uStack_3c0;
      expValue.fValue.f_datetime.f_milisec = (double)local_3b8;
      bVar2 = compareActualValue(dt_decimal,actValue,expValue);
      pXVar5 = local_378;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_378 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_378);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_1._4_4_ = 0;
    StrX::StrX(&local_408,lex_v_ran64_v_2 + 0x18);
    pXVar3 = StrX::unicodeForm(&local_408);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_decimal,(Status *)((long)&actRetValue_1 + 4),ver_10,
                        (bool)(lex_v_ran_v_1[0xb] & 1),
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_408);
    local_3f8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX((StrX *)local_468,pXVar3);
      StrX::localForm((StrX *)local_468);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x35d,lex_v_ran64_v_2 + 0x18);
      StrX::~StrX((StrX *)local_468);
      errSeen = true;
    }
    else {
      memcpy(&local_430,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran64_v_2.fValue + 0x18);
      memcpy(&local_458,pvVar10,0x28);
      actValue_00.fValue.f_long = uStack_428;
      actValue_00._0_8_ = local_430;
      actValue_00.fValue._8_8_ = local_420;
      actValue_00.fValue._16_8_ = uStack_418;
      actValue_00.fValue.f_datetime.f_milisec = (double)local_410;
      expValue_00.fValue.f_long = uStack_450;
      expValue_00._0_8_ = local_458;
      expValue_00.fValue._8_8_ = local_448;
      expValue_00.fValue._16_8_ = uStack_440;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_438;
      bVar2 = compareActualValue(dt_decimal,actValue_00,expValue_00);
      pXVar5 = local_3f8;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_3f8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_3f8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_2._4_4_ = 0;
    StrX::StrX(&local_488,lex_v_ran64_iv_1 + 0x18);
    pXVar3 = StrX::unicodeForm(&local_488);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_decimal,(Status *)((long)&actRetValue_2 + 4),ver_10,
                        (bool)(lex_v_ran_v_1[0xb] & 1),
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_488);
    local_478 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX((StrX *)local_4e8,pXVar3);
      StrX::localForm((StrX *)local_4e8);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x35e,lex_v_ran64_iv_1 + 0x18);
      StrX::~StrX((StrX *)local_4e8);
      errSeen = true;
    }
    else {
      memcpy(&local_4b0,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran32_v_1.fValue + 0x18);
      memcpy(&local_4d8,pvVar10,0x28);
      actValue_01.fValue.f_long = uStack_4a8;
      actValue_01._0_8_ = local_4b0;
      actValue_01.fValue._8_8_ = local_4a0;
      actValue_01.fValue._16_8_ = uStack_498;
      actValue_01.fValue.f_datetime.f_milisec = (double)local_490;
      expValue_01.fValue.f_long = uStack_4d0;
      expValue_01._0_8_ = local_4d8;
      expValue_01.fValue._8_8_ = local_4c8;
      expValue_01.fValue._16_8_ = uStack_4c0;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_4b8;
      bVar2 = compareActualValue(dt_decimal,actValue_01,expValue_01);
      pXVar5 = local_478;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_478 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_478);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_508,lex_iv_2 + 8);
    pXVar3 = StrX::unicodeForm(&local_508);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_decimal,(Status *)((long)&actRetValue_3 + 4),ver_10,
                        (bool)(lex_v_ran_v_1[0xb] & 1),
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_508);
    local_4f8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_3._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_decimal);
        StrX::StrX((StrX *)local_528,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_528);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_3._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x362,lex_iv_2 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_528);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX(&local_518,pXVar3);
      StrX::localForm(&local_518);
      pvVar10 = (void *)0x362;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x362,lex_iv_2 + 8);
      StrX::~StrX(&local_518);
      pXVar5 = local_4f8;
      errSeen = true;
      if (local_4f8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_4f8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_4._4_4_ = st_Init;
    StrX::StrX(&local_548,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar3 = StrX::unicodeForm(&local_548);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_decimal,(Status *)((long)&actRetValue_4 + 4),ver_10,
                        (bool)(lex_v_ran_v_1[0xb] & 1),
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_548);
    local_538 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_4._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_decimal);
        StrX::StrX((StrX *)&myStatus_12,pXVar3);
        pcVar4 = StrX::localForm((StrX *)&myStatus_12);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_4._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x363,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)&myStatus_12);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX(&local_558,pXVar3);
      StrX::localForm(&local_558);
      pvVar10 = (void *)0x363;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x363,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_558);
      pXVar5 = local_538;
      errSeen = true;
      if (local_538 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_538);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    lex_v_ran_v_1[0xb] = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar,data_canrep_1);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_decimal,(Status *)&actRetCanRep,ver_10,
                        (bool)(lex_v_ran_v_1[0xb] & 1),
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar);
    local_578 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX((StrX *)local_5b0,pXVar3);
      StrX::localForm((StrX *)local_5b0);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x381,data_canrep_1);
      StrX::~StrX((StrX *)local_5b0);
      errSeen = true;
    }
    else {
      local_590 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_590,data_rawstr_2);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_decimal);
        StrX::StrX(&local_5a0,pXVar3);
        pcVar4 = StrX::localForm(&local_5a0);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x381,data_canrep_1,pcVar4,local_590,data_rawstr_2);
        StrX::~StrX(&local_5a0);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_578);
      xercesc_4_0::XMLString::release(&local_590,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_1._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_1,data_canrep_2);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_1);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_decimal,(Status *)((long)&actRetCanRep_1 + 4),ver_10,
                        (bool)(lex_v_ran_v_1[0xb] & 1),
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_1);
    local_5c0 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX((StrX *)local_5f8,pXVar3);
      StrX::localForm((StrX *)local_5f8);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x382,data_canrep_2);
      StrX::~StrX((StrX *)local_5f8);
      errSeen = true;
    }
    else {
      local_5d8 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_5d8,data_rawstr_3);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_decimal);
        StrX::StrX(&local_5e8,pXVar3);
        pcVar4 = StrX::localForm(&local_5e8);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x382,data_canrep_2,pcVar4,local_5d8,data_rawstr_3);
        StrX::~StrX(&local_5e8);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_5c0);
      xercesc_4_0::XMLString::release(&local_5d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_2._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_2,data_canrep_3);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_2);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_decimal,(Status *)((long)&actRetCanRep_2 + 4),ver_10,
                        (bool)(lex_v_ran_v_1[0xb] & 1),
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_2);
    local_608 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX((StrX *)local_640,pXVar3);
      StrX::localForm((StrX *)local_640);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,899,data_canrep_3);
      StrX::~StrX((StrX *)local_640);
      errSeen = true;
    }
    else {
      local_620 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_620,data_rawstr_4 + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_decimal);
        StrX::StrX(&local_630,pXVar3);
        pcVar4 = StrX::localForm(&local_630);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,899,data_canrep_3,pcVar4,local_620,data_rawstr_4 + 8);
        StrX::~StrX(&local_630);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_608);
      xercesc_4_0::XMLString::release(&local_620,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_3._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_3,data_canrep_4);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_3);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_decimal,(Status *)((long)&actRetCanRep_3 + 4),ver_10,
                        (bool)(lex_v_ran_v_1[0xb] & 1),
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_3);
    local_650 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX((StrX *)local_688,pXVar3);
      StrX::localForm((StrX *)local_688);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,900,data_canrep_4);
      StrX::~StrX((StrX *)local_688);
      errSeen = true;
    }
    else {
      local_668 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_668,data_rawstr_5 + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_decimal);
        StrX::StrX(&local_678,pXVar3);
        pcVar4 = StrX::localForm(&local_678);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,900,data_canrep_4,pcVar4,local_668,data_rawstr_5 + 8);
        StrX::~StrX(&local_678);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_650);
      xercesc_4_0::XMLString::release(&local_668,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_4._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_4,data_canrep_5);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_4);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_decimal,(Status *)((long)&actRetCanRep_4 + 4),ver_10,
                        (bool)(lex_v_ran_v_1[0xb] & 1),
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_4);
    local_698 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX((StrX *)local_6d0,pXVar3);
      StrX::localForm((StrX *)local_6d0);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x385,data_canrep_5);
      StrX::~StrX((StrX *)local_6d0);
      errSeen = true;
    }
    else {
      local_6b0 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_6b0,data_rawstr_6 + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_decimal);
        StrX::StrX(&local_6c0,pXVar3);
        pcVar4 = StrX::localForm(&local_6c0);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x385,data_canrep_5,pcVar4,local_6b0,data_rawstr_6 + 8);
        StrX::~StrX(&local_6c0);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_698);
      xercesc_4_0::XMLString::release(&local_6b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_5._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_5,data_canrep_6);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_5);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_decimal,(Status *)((long)&actRetCanRep_5 + 4),ver_10,
                        (bool)(lex_v_ran_v_1[0xb] & 1),
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_5);
    local_6e0 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX((StrX *)local_718,pXVar3);
      StrX::localForm((StrX *)local_718);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x386,data_canrep_6);
      StrX::~StrX((StrX *)local_718);
      errSeen = true;
    }
    else {
      local_6f8 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_6f8,data_rawstr_7);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_decimal);
        StrX::StrX(&local_708,pXVar3);
        pcVar4 = StrX::localForm(&local_708);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x386,data_canrep_6,pcVar4,local_6f8,data_rawstr_7);
        StrX::~StrX(&local_708);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_6e0);
      xercesc_4_0::XMLString::release(&local_6f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_6._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_6,data_canrep_7);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_6);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_decimal,(Status *)((long)&actRetCanRep_6 + 4),ver_10,
                        (bool)(lex_v_ran_v_1[0xb] & 1),
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_6);
    local_728 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX((StrX *)local_760,pXVar3);
      StrX::localForm((StrX *)local_760);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x387,data_canrep_7);
      StrX::~StrX((StrX *)local_760);
      errSeen = true;
    }
    else {
      local_740 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_740,acStack_220);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_decimal);
        StrX::StrX(&local_750,pXVar3);
        pcVar4 = StrX::localForm(&local_750);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x387,data_canrep_7,pcVar4,local_740,acStack_220);
        StrX::~StrX(&local_750);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_728);
      xercesc_4_0::XMLString::release(&local_740,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_7._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_7,lex_v_ran64_v_2 + 0x18);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_7);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_decimal,(Status *)((long)&actRetCanRep_7 + 4),ver_10,
                        (bool)(lex_v_ran_v_1[0xb] & 1),
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_7);
    local_770 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX((StrX *)local_7a8,pXVar3);
      StrX::localForm((StrX *)local_7a8);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x389,lex_v_ran64_v_2 + 0x18);
      StrX::~StrX((StrX *)local_7a8);
      errSeen = true;
    }
    else {
      local_788 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_788,lex_v_ran64_v_2 + 0x18);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_decimal);
        StrX::StrX(&local_798,pXVar3);
        pcVar4 = StrX::localForm(&local_798);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x389,lex_v_ran64_v_2 + 0x18,pcVar4,local_788,lex_v_ran64_v_2 + 0x18);
        StrX::~StrX(&local_798);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_770);
      xercesc_4_0::XMLString::release(&local_788,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_8._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_8,lex_v_ran64_iv_1 + 0x18);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_8);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_decimal,(Status *)((long)&actRetCanRep_8 + 4),ver_10,
                        (bool)(lex_v_ran_v_1[0xb] & 1),
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_8);
    local_7b8 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX((StrX *)local_7f0,pXVar3);
      StrX::localForm((StrX *)local_7f0);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x38a,lex_v_ran64_iv_1 + 0x18);
      StrX::~StrX((StrX *)local_7f0);
      errSeen = true;
    }
    else {
      local_7d0 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_7d0,lex_v_ran64_iv_1 + 0x18);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_decimal);
        StrX::StrX(&local_7e0,pXVar3);
        pcVar4 = StrX::localForm(&local_7e0);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x38a,lex_v_ran64_iv_1 + 0x18,pcVar4,local_7d0,lex_v_ran64_iv_1 + 0x18);
        StrX::~StrX(&local_7e0);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_7b8);
      xercesc_4_0::XMLString::release(&local_7d0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_9._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_9,lex_v_ran64_iv_2 + 0x18);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_9);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_decimal,(Status *)((long)&actRetCanRep_9 + 4),ver_10,
                        (bool)(lex_v_ran_v_1[0xb] & 1),
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_9);
    local_800 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX((StrX *)local_838,pXVar3);
      StrX::localForm((StrX *)local_838);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x38b,lex_v_ran64_iv_2 + 0x18);
      StrX::~StrX((StrX *)local_838);
      errSeen = true;
    }
    else {
      local_818 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_818,lex_v_ran64_iv_2 + 0x18);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_decimal);
        StrX::StrX(&local_828,pXVar3);
        pcVar4 = StrX::localForm(&local_828);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x38b,lex_v_ran64_iv_2 + 0x18,pcVar4,local_818,lex_v_ran64_iv_2 + 0x18);
        StrX::~StrX(&local_828);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_800);
      xercesc_4_0::XMLString::release(&local_818,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_10._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_10,lex_iv_1 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_10);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_decimal,(Status *)((long)&actRetCanRep_10 + 4),ver_10,
                        (bool)(lex_v_ran_v_1[0xb] & 1),
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_10);
    local_848 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX((StrX *)local_880,pXVar3);
      StrX::localForm((StrX *)local_880);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x38c,lex_iv_1 + 8);
      StrX::~StrX((StrX *)local_880);
      errSeen = true;
    }
    else {
      local_860 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_860,lex_iv_1 + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_decimal);
        StrX::StrX(&local_870,pXVar3);
        pcVar4 = StrX::localForm(&local_870);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x38c,lex_iv_1 + 8,pcVar4,local_860,lex_iv_1 + 8);
        StrX::~StrX(&local_870);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_848);
      xercesc_4_0::XMLString::release(&local_860,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_11._4_4_ = st_Init;
    StrX::StrX(&local_8a0,lex_iv_2 + 8);
    pXVar3 = StrX::unicodeForm(&local_8a0);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_decimal,(Status *)((long)&actRetCanRep_11 + 4),ver_10,
                       (bool)(lex_v_ran_v_1[0xb] & 1),xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                      );
    StrX::~StrX(&local_8a0);
    local_890 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_11._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_decimal);
        StrX::StrX((StrX *)local_8c0,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_8c0);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_11._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x38d,lex_iv_2 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_8c0);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX(&local_8b0,pXVar3);
      StrX::localForm(&local_8b0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x38d,lex_iv_2 + 8);
      StrX::~StrX(&local_8b0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_890);
      errSeen = true;
    }
    actRetCanRep_12._4_4_ = st_Init;
    StrX::StrX(&local_8e0,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar3 = StrX::unicodeForm(&local_8e0);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_decimal,(Status *)((long)&actRetCanRep_12 + 4),ver_10,
                       (bool)(lex_v_ran_v_1[0xb] & 1),xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                      );
    StrX::~StrX(&local_8e0);
    local_8d0 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_12._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_decimal);
        StrX::StrX(&local_900,pXVar3);
        pcVar4 = StrX::localForm(&local_900);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_12._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x38e,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,pcVar6,pcVar7);
        StrX::~StrX(&local_900);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_decimal);
      StrX::StrX(&local_8f0,pXVar3);
      StrX::localForm(&local_8f0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x38e,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_8f0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_8d0);
      errSeen = true;
    }
  }
  return;
}

Assistant:

void test_dt_decimal()
{
    const XSValue::DataType dt = XSValue::dt_decimal;
    bool  toValidate = true;

    const char lex_v_ran_v_1[]="  1234.567  \n";
    const char lex_v_ran64_v_1[]="18446744073709551615.999";
    const char lex_v_ran64_v_2[]="999.18446744073709551615";
    const char lex_v_ran64_iv_1[]="18446744073709551616.999";
    const char lex_v_ran64_iv_2[]="999.18446744073709551616";

    const char lex_iv_1[]="12b34.456";
    const char lex_iv_2[]="1234.56.789";

    XSValue::XSValue_Data act_v_ran_v_1;   act_v_ran_v_1.fValue.f_double = (double)1234.567;
    XSValue::XSValue_Data act_v_ran64_v_1; act_v_ran64_v_1.fValue.f_double = (double)18446744073709551615.999;
    XSValue::XSValue_Data act_v_ran64_v_2; act_v_ran64_v_2.fValue.f_double = (double)999.18446744073709551615;
    //XSValue::XSValue_Data act_v_ran64_iv_1;="18446744073709551616.999";
    //XSValue::XSValue_Data act_v_ran64_iv_2;="999.18446744073709551616";

    XSValue::XSValue_Data act_v_ran32_v_1; act_v_ran32_v_1.fValue.f_double = (double)4294967295.999;
    XSValue::XSValue_Data act_v_ran32_v_2; act_v_ran32_v_2.fValue.f_double = (double)999.4294967295;
    //XSValue::XSValue_Data act_v_ran32_iv_1;="4294967296.999";
    //XSValue::XSValue_Data act_v_ran32_iv_2;="999.4294967296";

/***
 * 3.2.3.2 Canonical representation
 *
 * The canonical representation for decimal is defined by prohibiting certain options from the Lexical
 * representation (3.2.3.1). Specifically,
 * 1. the preceding optional "+" sign is prohibited.
 * 2. The decimal point is required.
 * 3. Leading and trailing zeroes are prohibited subject to the following:
 *       there must be at least one digit to the right and
 *       to the left of the decimal point which may be a zero.
 ***/

    const char data_rawstr_1[]="  -123.45  \n";
    const char data_canrep_1[]="-123.45";
    const char data_rawstr_2[]="+123.45";
    const char data_canrep_2[]="123.45";
    const char data_rawstr_3[]="12345";
    const char data_canrep_3[]="12345.0";
    const char data_rawstr_4[]="000123.45";
    const char data_canrep_4[]="123.45";
    const char data_rawstr_5[]="123.45000";
    const char data_canrep_5[]="123.45";
    const char data_rawstr_6[]="00.12345";
    const char data_canrep_6[]="0.12345";
    const char data_rawstr_7[]="123.00";
    const char data_canrep_7[]="123.0";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid       n/a
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid
    VALIDATE_TEST(lex_v_ran_v_1    , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_iv_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_iv_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_1,    dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);

        ACTVALUE_TEST(lex_v_ran64_v_1 , dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran64_v_1);
        ACTVALUE_TEST(lex_v_ran64_v_2 , dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran64_v_2);
        //ACTVALUE_TEST(lex_v_ran64_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0001);
        //ACTVALUE_TEST(lex_v_ran64_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0001);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran32_v_1);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran32_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    DONT_CARE);
        CANREP_TEST(data_rawstr_3,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_3,    DONT_CARE);
        CANREP_TEST(data_rawstr_4,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_4,    DONT_CARE);
        CANREP_TEST(data_rawstr_5,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_5,    DONT_CARE);
        CANREP_TEST(data_rawstr_6,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_6,    DONT_CARE);
        CANREP_TEST(data_rawstr_7,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_7,    DONT_CARE);

        CANREP_TEST(lex_v_ran64_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_v_1,  DONT_CARE);
        CANREP_TEST(lex_v_ran64_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_v_2,  DONT_CARE);
        CANREP_TEST(lex_v_ran64_iv_1, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_iv_1, DONT_CARE);
        CANREP_TEST(lex_v_ran64_iv_2, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_iv_2, DONT_CARE);
        CANREP_TEST(lex_iv_1        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,                XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,                XSValue::st_FOCA0002);

    }

}